

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O0

void __thiscall QLibraryPrivate::setLoadHints(QLibraryPrivate *this,LoadHints lh)

{
  bool bVar1;
  int newValue;
  QLibraryPrivate *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QBasicMutex> lock;
  QBasicMutex *in_stack_ffffffffffffffc8;
  QLibraryPrivate *pQVar2;
  QFlags<QLibrary::LoadHint> local_1c;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  QFlagsStorage<QLibrary::LoadHint> lh_00;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  bVar1 = QString::isEmpty((QString *)0x8c24de);
  lh_00.i = (Int)((ulong)pQVar2 >> 0x20);
  if (bVar1) {
    newValue = (int)((ulong)&in_RDI->loadHintsInt >> 0x20);
    QFlags<QLibrary::LoadHint>::toInt(&local_1c);
    QBasicAtomicInteger<int>::storeRelaxed((QBasicAtomicInteger<int> *)in_RDI,newValue);
  }
  else {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QMutexLocker<QBasicMutex>::QMutexLocker
              ((QMutexLocker<QBasicMutex> *)in_RDI,in_stack_ffffffffffffffc8);
    mergeLoadHints(in_RDI,(LoadHints)lh_00.i);
    QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLibraryPrivate::setLoadHints(QLibrary::LoadHints lh)
{
    // Set the load hints directly for a dummy if this object is not associated
    // with a file. Such object is not shared between multiple instances.
    if (fileName.isEmpty()) {
        loadHintsInt.storeRelaxed(lh.toInt());
        return;
    }

    // this locks a global mutex
    QMutexLocker lock(&qt_library_mutex);
    mergeLoadHints(lh);
}